

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O2

void __thiscall QUrlQueryPrivate::addQueryItem(QUrlQueryPrivate *this,QString *key,QString *value)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_78;
  QArrayDataPointer<char16_t> local_60;
  pair<QString,_QString> local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  recodeFromUser((QString *)&local_60,this,key);
  recodeFromUser((QString *)&QStack_78,this,value);
  std::pair<QString,_QString>::pair<QString,_QString,_true>
            (&local_48,(QString *)&local_60,(QString *)&QStack_78);
  QList<std::pair<QString,QString>>::emplaceBack<std::pair<QString,QString>>
            ((QList<std::pair<QString,QString>> *)&this->itemList,&local_48);
  std::pair<QString,_QString>::~pair(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void addQueryItem(const QString &key, const QString &value)
    { itemList.append(std::make_pair(recodeFromUser(key), recodeFromUser(value))); }